

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adler32.c
# Opt level: O0

z_uLong adler32_combine(z_uLong adler1,z_uLong adler2,int len2)

{
  undefined1 auVar1 [12];
  int iVar2;
  undefined4 local_1c;
  uint rem;
  uint sum2;
  uint sum1;
  int len2_local;
  z_uLong adler2_local;
  z_uLong adler1_local;
  
  auVar1._8_4_ = 0;
  auVar1._0_8_ = (long)len2;
  iVar2 = SUB124(auVar1 % ZEXT812(0xfff1),0);
  rem = (adler1 & 0xffff) + (adler2 & 0xffff) + 0xfff0;
  local_1c = (iVar2 * (adler1 & 0xffff)) % 0xfff1 +
             (((adler1 >> 0x10) + (adler2 >> 0x10) + 0xfff1) - iVar2);
  if (0xfff1 < rem) {
    rem = rem - 0xfff1;
  }
  if (0xfff1 < rem) {
    rem = rem - 0xfff1;
  }
  if (0x1ffe2 < local_1c) {
    local_1c = local_1c - 0x1ffe2;
  }
  if (0xfff1 < local_1c) {
    local_1c = local_1c - 0xfff1;
  }
  return rem | local_1c << 0x10;
}

Assistant:

uLong ZEXPORT adler32_combine(adler1, adler2, len2)
    uLong adler1;
    uLong adler2;
    z_off_t len2;
{
    unsigned int sum1;
    unsigned int sum2;
    unsigned rem;

    /* the derivation of this formula is left as an exercise for the reader */
    rem = (unsigned)(len2 % BASE);
    sum1 = adler1 & 0xffff;
    sum2 = rem * sum1;
    MOD(sum2);
    sum1 += (adler2 & 0xffff) + BASE - 1;
    sum2 += ((adler1 >> 16) & 0xffff) + ((adler2 >> 16) & 0xffff) + BASE - rem;
    if (sum1 > BASE) sum1 -= BASE;
    if (sum1 > BASE) sum1 -= BASE;
    if (sum2 > (BASE << 1)) sum2 -= (BASE << 1);
    if (sum2 > BASE) sum2 -= BASE;
    return sum1 | (sum2 << 16);
}